

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O1

CharCount __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::RepeatCount
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this)

{
  byte bVar1;
  code *pcVar2;
  CharCount CVar3;
  bool bVar4;
  undefined4 *puVar5;
  uint uVar6;
  CharCount unaff_R13D;
  int iVar7;
  int iVar8;
  
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  iVar7 = 0;
  uVar6 = 0;
  do {
    if (this->inputLim < this->next) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar4) goto LAB_00edb379;
      *puVar5 = 0;
    }
    bVar1 = *this->next;
    if ((ASCIIChars::classes[bVar1] & 0x10) == 0) {
      iVar8 = 1;
      unaff_R13D = uVar6;
      if (iVar7 == 0) {
        Fail(this,-0x7ff5ec67);
      }
    }
    else {
      iVar8 = 3;
      if (uVar6 < 0xccccccd) {
        uVar6 = uVar6 * 10;
        bVar1 = ASCIIChars::values[bVar1];
        if (uVar6 <= 0x7ffffffe - bVar1) {
          if (this->inputLim < this->next + 1) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar5 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
            if (!bVar4) goto LAB_00edb379;
            *puVar5 = 0;
          }
          if ((char)*this->next < '\0') {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar5 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0xd6,"(!this->IsMultiUnitChar(next[i]))",
                               "!this->IsMultiUnitChar(next[i])");
            if (!bVar4) goto LAB_00edb379;
            *puVar5 = 0;
          }
          uVar6 = uVar6 + bVar1;
          iVar7 = iVar7 + 1;
          this->next = this->next + 1;
          iVar8 = 0;
        }
      }
    }
  } while (iVar8 == 0);
  if (iVar8 == 3) {
    if (iVar7 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x47c,"(digits != 0)","digits != 0");
      if (!bVar4) {
LAB_00edb379:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      if (this->inputLim < this->next) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar5 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar4) goto LAB_00edb379;
        *puVar5 = 0;
      }
      bVar1 = ASCIIChars::classes[*this->next];
      CVar3 = 0x7ffffffe;
      if ((bVar1 & 0x10) != 0) {
        if (this->inputLim < this->next + 1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
          if (!bVar4) goto LAB_00edb379;
          *puVar5 = 0;
        }
        if ((char)*this->next < '\0') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xd6,"(!this->IsMultiUnitChar(next[i]))",
                             "!this->IsMultiUnitChar(next[i])");
          if (!bVar4) goto LAB_00edb379;
          *puVar5 = 0;
        }
        this->next = this->next + 1;
        CVar3 = unaff_R13D;
      }
      unaff_R13D = CVar3;
    } while ((bVar1 & 0x10) != 0);
  }
  return unaff_R13D;
}

Assistant:

CharCount Parser<P, IsLiteral>::RepeatCount()
    {
        CharCount n = 0;
        int digits = 0;
        while (true)
        {
            // Could be terminating 0
            EncodedChar ec = ECLookahead();
            if (!standardEncodedChars->IsDigit(ec))
            {
                if (digits == 0)
                {
                    Fail(JSERR_RegExpSyntax);
                }

                return n;
            }

            if (n > MaxCharCount / 10)
            {
                break;
            }

            n *= 10;
            if (n > MaxCharCount - standardEncodedChars->DigitValue(ec))
            {
                break;
            }

            n += standardEncodedChars->DigitValue(ec);
            digits++;
            ECConsume();
        }

        Assert(digits != 0); // shouldn't be able to reach here with (digits == 0)

        // The token had a value larger than MaxCharCount so we didn't return the value and reached here instead.
        // Consume the rest of the token and return MaxCharCount.
        while (true)
        {
            EncodedChar ec = ECLookahead();
            if (!standardEncodedChars->IsDigit(ec))
            {
                return MaxCharCount;
            }
            ECConsume();
        }
    }